

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  archive_string_conv *paVar3;
  int local_34;
  int ret;
  cpio *cpio;
  char *val_local;
  char *key_local;
  archive_read *a_local;
  
  local_34 = -0x19;
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"compat-2x");
  if (iVar2 == 0) {
    *(uint *)((long)pvVar1 + 0x48) = (uint)(val != (char *)0x0);
    a_local._4_4_ = 0;
  }
  else {
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      if ((val == (char *)0x0) || (*val == '\0')) {
        archive_set_error(&a->archive,-1,"cpio: hdrcharset option needs a character-set name");
      }
      else {
        paVar3 = archive_string_conversion_from_charset((archive_conflict *)a,val,L'\0');
        *(archive_string_conv **)((long)pvVar1 + 0x38) = paVar3;
        if (*(long *)((long)pvVar1 + 0x38) == 0) {
          local_34 = -0x1e;
        }
        else {
          local_34 = 0;
        }
      }
      a_local._4_4_ = local_34;
    }
    else {
      iVar2 = strcmp(key,"pwb");
      if (iVar2 == 0) {
        if ((val != (char *)0x0) && (*val != '\0')) {
          *(undefined4 *)((long)pvVar1 + 0x4c) = 1;
        }
        a_local._4_4_ = 0;
      }
      else {
        a_local._4_4_ = -0x14;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cpio_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct cpio *cpio;
	int ret = ARCHIVE_FAILED;

	cpio = (struct cpio *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle filenames as libarchive 2.x */
		cpio->init_default_conversion = (val != NULL)?1:0;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "cpio: hdrcharset option needs a character-set name");
		else {
			cpio->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (cpio->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "pwb")  == 0) {
		if (val != NULL && val[0] != 0)
			cpio->option_pwb = 1;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}